

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpletz.cpp
# Opt level: O3

UBool __thiscall
icu_63::SimpleTimeZone::getPreviousTransition
          (SimpleTimeZone *this,UDate base,UBool inclusive,TimeZoneTransition *result)

{
  AnnualTimeZoneRule **ppAVar1;
  AnnualTimeZoneRule *pAVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  AnnualTimeZoneRule **ppAVar7;
  AnnualTimeZoneRule **ppAVar8;
  UDate UVar9;
  double time;
  UDate dstDate;
  UDate stdDate;
  UErrorCode status;
  double local_48;
  double local_40;
  UErrorCode local_34;
  
  if (this->useDaylight == '\0') {
    return '\0';
  }
  local_34 = U_ZERO_ERROR;
  checkTransitionRules(this,&local_34);
  if (((local_34 < U_ILLEGAL_ARGUMENT_ERROR) &&
      (UVar9 = TimeZoneTransition::getTime(this->firstTransition), UVar9 <= base)) &&
     ((inclusive != '\0' || ((UVar9 != base || (NAN(UVar9) || NAN(base))))))) {
    ppAVar8 = &this->stdRule;
    ppAVar1 = &this->dstRule;
    pAVar2 = this->stdRule;
    uVar3 = TimeZoneRule::getRawOffset(&this->dstRule->super_TimeZoneRule);
    uVar4 = TimeZoneRule::getDSTSavings(&this->dstRule->super_TimeZoneRule);
    iVar5 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                      (base,pAVar2,(ulong)uVar3,(ulong)uVar4,(ulong)(uint)(int)inclusive,&local_40);
    pAVar2 = this->dstRule;
    uVar3 = TimeZoneRule::getRawOffset(&this->stdRule->super_TimeZoneRule);
    uVar4 = TimeZoneRule::getDSTSavings(&this->stdRule->super_TimeZoneRule);
    iVar6 = (*(pAVar2->super_TimeZoneRule).super_UObject._vptr_UObject[10])
                      (base,pAVar2,(ulong)uVar3,(ulong)uVar4,(ulong)(uint)(int)inclusive,&local_48);
    if ((char)iVar5 == '\0') {
      ppAVar7 = ppAVar8;
      ppAVar8 = ppAVar1;
      time = local_48;
      if ((char)iVar6 != '\0') goto LAB_001f7b46;
    }
    else {
      ppAVar7 = ppAVar1;
      time = local_40;
      if ((((char)iVar6 == '\0') || (local_48 < local_40)) ||
         (ppAVar7 = ppAVar8, ppAVar8 = ppAVar1, time = local_48, local_40 < local_48)) {
LAB_001f7b46:
        TimeZoneTransition::setTime(result,time);
        TimeZoneTransition::setFrom(result,&(*ppAVar7)->super_TimeZoneRule);
        TimeZoneTransition::setTo(result,&(*ppAVar8)->super_TimeZoneRule);
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

UBool
SimpleTimeZone::getPreviousTransition(UDate base, UBool inclusive, TimeZoneTransition& result) const {
    if (!useDaylight) {
        return FALSE;
    }

    UErrorCode status = U_ZERO_ERROR;
    checkTransitionRules(status);
    if (U_FAILURE(status)) {
        return FALSE;
    }

    UDate firstTransitionTime = firstTransition->getTime();
    if (base < firstTransitionTime || (!inclusive && base == firstTransitionTime)) {
        return FALSE;
    }
    UDate stdDate, dstDate;
    UBool stdAvail = stdRule->getPreviousStart(base, dstRule->getRawOffset(), dstRule->getDSTSavings(), inclusive, stdDate);
    UBool dstAvail = dstRule->getPreviousStart(base, stdRule->getRawOffset(), stdRule->getDSTSavings(), inclusive, dstDate);
    if (stdAvail && (!dstAvail || stdDate > dstDate)) {
        result.setTime(stdDate);
        result.setFrom((const TimeZoneRule&)*dstRule);
        result.setTo((const TimeZoneRule&)*stdRule);
        return TRUE;
    }
    if (dstAvail && (!stdAvail || dstDate > stdDate)) {
        result.setTime(dstDate);
        result.setFrom((const TimeZoneRule&)*stdRule);
        result.setTo((const TimeZoneRule&)*dstRule);
        return TRUE;
    }
    return FALSE;
}